

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O3

int zt_unit_run_by_name(zt_unit *unit,char *name)

{
  char *pcVar1;
  char *__s;
  int iVar2;
  int iVar3;
  char **__ptr;
  size_t sVar4;
  size_t sVar5;
  zt_unit *unit_00;
  zt_unit_test *test;
  zt_unit_suite *suite;
  int count;
  int local_34;
  
  __ptr = str_split(name,".",&local_34);
  iVar3 = -1;
  if (0xfffffffd < local_34 - 3U) {
    pcVar1 = *__ptr;
    sVar4 = strlen(pcVar1);
    suite = (zt_unit_suite *)(unit->suites).next;
    iVar3 = -1;
    if (suite == (zt_unit_suite *)unit) goto LAB_001040c3;
    do {
      __s = suite->name;
      sVar5 = strlen(__s);
      if ((sVar4 == sVar5) && (iVar2 = strncmp(__s,pcVar1,sVar4), iVar2 == 0)) {
        if (local_34 == 1) {
          zt_unit_run_suite(unit,suite);
          goto LAB_001040b7;
        }
        pcVar1 = __ptr[1];
        sVar4 = strlen(pcVar1);
        test = (zt_unit_test *)(suite->tests).next;
        if (test == (zt_unit_test *)&suite->tests) goto LAB_001040c3;
        iVar3 = -1;
        goto LAB_00104109;
      }
      suite = (zt_unit_suite *)(suite->suite).next;
    } while (suite != (zt_unit_suite *)unit);
    iVar3 = -1;
  }
LAB_001040be:
  if (__ptr == (char **)0x0) {
    return iVar3;
  }
LAB_001040c3:
  free(__ptr);
  return iVar3;
LAB_00104109:
  unit_00 = (zt_unit *)test->name;
  sVar5 = strlen((char *)unit_00);
  if ((sVar4 != sVar5) || (iVar2 = strncmp((char *)unit_00,pcVar1,sVar4), iVar2 != 0))
  goto LAB_0010412e;
  iVar3 = zt_unit_run_test(unit_00,suite,test);
  if (iVar3 == 0) {
    unit->failures = unit->failures + 1;
  }
  else {
    unit->successes = unit->successes + 1;
  }
LAB_001040b7:
  iVar3 = 0;
  goto LAB_001040be;
LAB_0010412e:
  test = (zt_unit_test *)(test->test).next;
  if (test == (zt_unit_test *)&suite->tests) goto LAB_001040be;
  goto LAB_00104109;
}

Assistant:

int
zt_unit_run_by_name(struct zt_unit    * unit,
                    char    * name)
{
    int                    count;
    char                 **targetv;
    struct zt_unit_suite * unit_suite = NULL;
    struct zt_unit_test  * unit_test = NULL;
    zt_elist_t           * tmp;
    int                    result = 0;
    size_t                 len;

    targetv = str_split(name, ".", &count);

    if (count <= 0 || count > 2) {
        result = -1;
        goto done;
    }

    len = strlen(targetv[0]);
    zt_elist_for_each(&unit->suites, tmp) {
        unit_suite = zt_elist_data(tmp, struct zt_unit_suite, suite);
        if (len == strlen(unit_suite->name)) {
            if (strncmp(unit_suite->name, targetv[0], len) == 0) {
                break;
            }
        }
        unit_suite = NULL;
    }

    if (unit_suite == NULL) {
        result = -1;
        goto done;
    }

    if (count == 1) {
        result = zt_unit_run_suite(unit, unit_suite);
        goto done;
    }

    len = strlen(targetv[1]);
    zt_elist_for_each(&unit_suite->tests, tmp) {
        unit_test = zt_elist_data(tmp, struct zt_unit_test, test);
        if (len == strlen(unit_test->name)) {
            if (strncmp(unit_test->name, targetv[1], len) == 0) {
                break;
            }
        }
        unit_test = NULL;
    }

    if (unit_test == NULL) {
        result = -1;
        goto done;
    }

    if (zt_unit_run_test(unit, unit_suite, unit_test) == FALSE) {
        unit->failures += 1;
    } else {
        unit->successes += 1;
    }

done:
    str_split_free(&targetv);
    return result;
}